

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier.h
# Opt level: O0

void __thiscall
bezier::PolynomialCoefficients<0UL>::PolynomialCoefficients(PolynomialCoefficients<0UL> *this)

{
  size_t sVar1;
  bool bVar2;
  reference pvVar3;
  size_t i;
  PolynomialCoefficients<0UL> *this_local;
  
  std::array<bezier::PolynomialPair,_1UL>::array(&this->mPolynomialPairs);
  bVar2 = false;
  while( true ) {
    if (bVar2) {
      return;
    }
    pvVar3 = std::array<bezier::PolynomialPair,_1UL>::operator[](&this->mPolynomialPairs,0);
    pvVar3->t = 0;
    pvVar3 = std::array<bezier::PolynomialPair,_1UL>::operator[](&this->mPolynomialPairs,0);
    pvVar3->one_minus_t = 0;
    pvVar3 = std::array<bezier::PolynomialPair,_1UL>::operator[](&this->mPolynomialPairs,0);
    sVar1 = pvVar3->t;
    pvVar3 = std::array<bezier::PolynomialPair,_1UL>::operator[](&this->mPolynomialPairs,0);
    if (sVar1 + pvVar3->one_minus_t != 0) break;
    bVar2 = true;
  }
  __assert_fail("mPolynomialPairs[i].t + mPolynomialPairs[i].one_minus_t == N",
                "/workspace/llm4binary/github/license_c_cmakelists/oysteinmyrmo[P]bezier/include/bezier/bezier.h"
                ,0x74,"bezier::PolynomialCoefficients<0>::PolynomialCoefficients() [N = 0]");
}

Assistant:

PolynomialCoefficients()
        {
            for (size_t i = 0; i <= N; i++)
            {
                mPolynomialPairs[i].t = i;
                mPolynomialPairs[i].one_minus_t = N - i;
                assert(mPolynomialPairs[i].t + mPolynomialPairs[i].one_minus_t == N);
            }
        }